

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::segmentcheck(string *unit,char closeSegment,size_t *index)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  
  do {
    while( true ) {
      uVar1 = *index;
      if (unit->_M_string_length <= uVar1) {
        return false;
      }
      cVar2 = (unit->_M_dataplus)._M_p[uVar1];
      *index = uVar1 + 1;
      if (cVar2 == closeSegment) {
        return true;
      }
      if ((cVar2 != '\"') && (cVar2 != '(')) break;
      cVar2 = getMatchCharacter(cVar2);
LAB_00340744:
      bVar3 = segmentcheck(unit,cVar2,index);
      if (!bVar3) {
        return false;
      }
    }
    if (cVar2 == '[') {
LAB_00340737:
      cVar2 = getMatchCharacter(cVar2);
      if (cVar2 == closeSegment) {
        return false;
      }
      goto LAB_00340744;
    }
    if (cVar2 == '\\') {
      *index = uVar1 + 2;
    }
    else {
      if (cVar2 == '{') goto LAB_00340737;
      if (cVar2 == ')') {
        return false;
      }
      if (cVar2 == ']') {
        return false;
      }
      if (cVar2 == '}') {
        return false;
      }
    }
  } while( true );
}

Assistant:

static bool
    segmentcheck(const std::string& unit, char closeSegment, size_t& index)
{
    while (index < unit.size()) {
        char current = unit[index];
        ++index;
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '\\':
                ++index;
                break;
            case '(':
            case '"':
                if (!segmentcheck(unit, getMatchCharacter(current), index)) {
                    return false;
                }
                break;
            case '{':
            case '[': {
                auto close = getMatchCharacter(current);
                if (close == closeSegment) {
                    return false;
                }
                if (!segmentcheck(unit, close, index)) {
                    return false;
                }
                break;
            }
            case '}':
            case ')':
            case ']':
                return false;
            default:
                break;
        }
    }
    return false;
}